

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O1

void __thiscall
nn::ESoinn::labelClasses
          (ESoinn *this,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *node_axis)

{
  ConcreteLogger *this_00;
  pointer pEVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  string local_58;
  uint32_t local_34 [2];
  uint32_t num_axis;
  
  this_00 = log_netw;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"labelClasses function","");
  logger::ConcreteLogger::debug(this_00,&local_58,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pEVar1 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_Neurons).
      super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar1) {
    uVar4 = 1;
    uVar2 = 0;
    do {
      if (pEVar1[uVar2].m_IsDeleted == false) {
        isNodeAxis(this,uVar4 - 1);
      }
      uVar2 = (ulong)uVar4;
      pEVar1 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 3) *
              -0xf0f0f0f0f0f0f0f;
      uVar4 = uVar4 + 1;
    } while (uVar2 <= uVar3 && uVar3 - uVar2 != 0);
  }
  local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
  pEVar1 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_Neurons).
      super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar1) {
    uVar2 = 0;
    do {
      if (pEVar1[uVar2].m_IsDeleted == false) {
        local_34[0] = findAxisForNode(this,(uint32_t)uVar2);
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
        ::_M_emplace_unique<unsigned_int&,unsigned_int&>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                    *)node_axis,(uint *)&local_58,local_34);
        (this->m_Neurons).
        super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
        super__Vector_impl_data._M_start[(ulong)local_58._M_dataplus._M_p & 0xffffffff].m_CurClass =
             local_34[0];
      }
      uVar2 = (ulong)((uint)local_58._M_dataplus._M_p + 1);
      local_58._M_dataplus._M_p._0_4_ = (uint)local_58._M_dataplus._M_p + 1;
      pEVar1 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 3) *
              -0xf0f0f0f0f0f0f0f;
    } while (uVar2 <= uVar3 && uVar3 - uVar2 != 0);
  }
  return;
}

Assistant:

void ESoinn::labelClasses(std::map<uint32_t, uint32_t>& node_axis)
    {
        log_netw->debug("labelClasses function");
        //find neighbour with max density for each neuron
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            isNodeAxis(i);
        }
        
        //find axis for each node
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            uint32_t num_axis = findAxisForNode(i);
            node_axis.emplace(i, num_axis);
            m_Neurons[i].setCurClass(num_axis);
        }
    }